

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O2

JSON __thiscall JSON::parse(JSON *this,string *s)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  JSON JVar1;
  BufferInputSource bis;
  JSONParser jp;
  allocator<char> local_41b9;
  BufferInputSource local_41b8;
  undefined1 local_40d0 [20];
  char local_40bc [16388];
  size_t local_b8;
  char *local_b0;
  qpdf_offset_t local_a8;
  undefined1 uStack_a0;
  undefined7 uStack_9f;
  undefined1 uStack_98;
  undefined8 uStack_97;
  _Alloc_hider local_88;
  size_type local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  qpdf_offset_t local_68;
  parser_state_e local_60;
  pointer local_58;
  pointer pSStack_50;
  pointer local_48;
  _Alloc_hider local_40;
  size_type local_38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  qpdf_offset_t local_20;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)local_40d0,"json input",&local_41b9);
  BufferInputSource::BufferInputSource(&local_41b8,(string *)local_40d0,s);
  std::__cxx11::string::~string((string *)local_40d0);
  local_40d0._8_8_ = (Reactor *)0x0;
  local_40d0._16_4_ = 0;
  local_b8 = 0;
  local_b0 = local_40bc;
  local_88._M_p = (pointer)&local_78;
  local_a8 = 0;
  uStack_a0 = 0;
  uStack_9f = 0;
  uStack_98 = 0;
  uStack_97 = 0;
  local_80 = 0;
  local_78._M_local_buf[0] = '\0';
  local_68 = 0;
  local_60 = ps_top;
  local_58 = (pointer)0x0;
  pSStack_50 = (pointer)0x0;
  local_48 = (pointer)0x0;
  local_40._M_p = (pointer)&local_30;
  local_38 = 0;
  local_30._M_local_buf[0] = '\0';
  local_20 = 0;
  local_40d0._0_8_ = &local_41b8;
  anon_unknown.dwarf_42d07::JSONParser::parse((JSONParser *)this);
  anon_unknown.dwarf_42d07::JSONParser::~JSONParser((JSONParser *)local_40d0);
  BufferInputSource::~BufferInputSource(&local_41b8);
  JVar1.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  JVar1.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (JSON)JVar1.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

JSON
JSON::parse(std::string const& s)
{
    BufferInputSource bis("json input", s);
    JSONParser jp(bis, nullptr);
    return jp.parse();
}